

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

omp_allocator_handle_t
omp_init_allocator_(omp_memspace_handle_t *m,int *ntraits,omp_alloctrait_t *tr)

{
  omp_allocator_handle_t pvVar1;
  int in_stack_0000001c;
  
  __kmp_get_global_thread_id_reg();
  pvVar1 = __kmpc_init_allocator(in_stack_0000001c,m,ntraits._4_4_,tr);
  return pvVar1;
}

Assistant:

omp_allocator_handle_t FTN_STDCALL
FTN_INIT_ALLOCATOR(omp_memspace_handle_t KMP_DEREF m, int KMP_DEREF ntraits,
                   omp_alloctrait_t tr[]) {
#ifdef KMP_STUB
  return NULL;
#else
  return __kmpc_init_allocator(__kmp_entry_gtid(), KMP_DEREF m,
                               KMP_DEREF ntraits, tr);
#endif
}